

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O2

bool tcmalloc::anon_unknown_0::StringToIntegerUntilCharWithCheck<long>
               (long *outptr,char *text,int base,int c,char **endptr)

{
  char *pcVar1;
  char **text_pointer;
  bool bVar2;
  longlong lVar3;
  undefined4 in_register_0000000c;
  char *local_40;
  char *local_38;
  char *endptr_extract;
  
  text_pointer = (char **)CONCAT44(in_register_0000000c,c);
  pcVar1 = *(char **)CONCAT44(in_register_0000000c,c);
  *(undefined8 *)CONCAT44(in_register_0000000c,c) = 0;
  bVar2 = ExtractUntilChar(pcVar1,base,&local_38);
  if (bVar2) {
    lVar3 = strtoll(pcVar1,&local_40,(int)text);
    *local_38 = (char)base;
    if (local_38 == local_40) {
      *text_pointer = local_38;
      SkipWhileWhitespace(text_pointer,base);
      goto LAB_00117cdd;
    }
  }
  lVar3 = 0;
LAB_00117cdd:
  *outptr = lVar3;
  pcVar1 = *text_pointer;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    bVar2 = false;
  }
  else {
    *text_pointer = pcVar1 + 1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool StringToIntegerUntilCharWithCheck(
    T *outptr, char *text, int base, int c, char **endptr) {
  *outptr = StringToIntegerUntilChar<T>(*endptr, base, c, endptr);
  if (*endptr == nullptr || **endptr == '\0') return false;
  ++(*endptr);
  return true;
}